

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

char16 * __thiscall
Js::FunctionProxy::GetShortDisplayName(FunctionProxy *this,charcount_t *shortNameLength)

{
  char16 *src;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  BOOL BVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  Recycler *this_00;
  char16 *dst;
  bool bVar8;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  iVar3 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])();
  dst = (char16 *)CONCAT44(extraout_var,iVar3);
  uVar4 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[8])(this);
  if (dst == (char16 *)0x0) {
    dst = L"";
    uVar4 = 0;
  }
  else {
    if ((((dst == L"Function code") || (dst == L"Unknown script code")) || (dst == L"anonymous")) ||
       (((dst == L"Module code" || (dst == L"Global code")) ||
        ((dst == L"glo" || (dst == L"Anonymous function")))))) goto LAB_0076d2e8;
    uVar5 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[9])(this);
    if (uVar5 == 0) {
      bVar8 = false;
    }
    else {
      bVar8 = dst[uVar5 - 1] == L'[';
    }
    if (uVar4 < uVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)data._32_8_ = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xad5,"(nameLength >= shortNameOffset)",
                                  "nameLength >= shortNameOffset");
      if (!bVar2) goto LAB_0076d300;
      *(undefined4 *)data._32_8_ = 0;
    }
    src = dst + uVar5;
    *shortNameLength = uVar4 - uVar5;
    if (!bVar8) {
      return src;
    }
    if (dst[uVar4 - 1] != L']') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xadd,"(name[nameLength - 1] == \']\')",
                                  "name[nameLength - 1] == \']\'");
      if (!bVar8) goto LAB_0076d300;
      *puVar7 = 0;
    }
    data.plusSize = (size_t)*shortNameLength;
    local_70 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0xade;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (this->m_scriptContext->recycler,(TrackAllocData *)local_70);
    uVar4 = *shortNameLength;
    if ((ulong)uVar4 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      dst = (char16 *)&DAT_00000008;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar8) goto LAB_0076d300;
        *puVar7 = 0;
      }
      dst = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (this_00,(ulong)uVar4 * 2);
      if (dst == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar8) {
LAB_0076d300:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
    }
    js_wmemcpy_s(dst,(ulong)*shortNameLength,src,(ulong)(*shortNameLength - 1));
    uVar4 = *shortNameLength - 1;
    dst[uVar4] = L'\0';
  }
LAB_0076d2e8:
  *shortNameLength = uVar4;
  return dst;
}

Assistant:

const char16* FunctionProxy::GetShortDisplayName(charcount_t * shortNameLength)
    {
        const char16* name = this->GetDisplayName();
        uint nameLength = this->GetDisplayNameLength();

        if (name == nullptr)
        {
            *shortNameLength = 0;
            return Constants::Empty;
        }

        if (IsConstantFunctionName(name))
        {
            *shortNameLength = nameLength;
            return name;
        }
        uint shortNameOffset = this->GetShortDisplayNameOffset();
        const char16 * shortName = name + shortNameOffset;
        bool isBracketCase = shortNameOffset != 0 && name[shortNameOffset-1] == '[';
        Assert(nameLength >= shortNameOffset);
        *shortNameLength = nameLength - shortNameOffset;

        if (!isBracketCase)
        {
            return shortName;
        }

        Assert(name[nameLength - 1] == ']');
        char16 * finalshorterName = RecyclerNewArrayLeaf(this->GetScriptContext()->GetRecycler(), char16, *shortNameLength);
        js_wmemcpy_s(finalshorterName, *shortNameLength, shortName, *shortNameLength - 1); // we don't want the last character in shorterName
        finalshorterName[*shortNameLength - 1] = _u('\0');
        *shortNameLength = *shortNameLength - 1;
        return finalshorterName;
    }